

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8Fallback
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  bool bVar1;
  int s;
  char *pcVar2;
  char *pcVar3;
  uint s_00;
  char *pcVar5;
  LeftoverBuffer leftover;
  anon_class_8_1_4e65a6d9 local_48;
  LeftoverBuffer local_40;
  int iVar4;
  
  local_48.leftover = &local_40;
  local_40.size = 0;
  s = BytesAvailable(this,ptr);
  pcVar3 = (char *)0x0;
  do {
    iVar4 = (int)size;
    s_00 = iVar4 - s;
    size = (size_t)s_00;
    if (s_00 == 0 || iVar4 < s) {
      VerifyUTF8Fallback((EpsCopyInputStream *)&stack0xffffffffffffffc8);
    }
    pcVar5 = pcVar3;
    if (this->next_chunk_ == (char *)0x0) goto LAB_002fc21b;
    bVar1 = VerifyUTF8Fallback::anon_class_8_1_4e65a6d9::operator()(&local_48,ptr,s);
    if ((!bVar1) || (this->limit_ < 0x11)) goto LAB_002fc21b;
    pcVar2 = Next(this);
    pcVar5 = (char *)0x0;
    if (pcVar2 == (char *)0x0) goto LAB_002fc21b;
    ptr = pcVar2 + 0x10;
    s = BytesAvailable(this,ptr);
  } while (s < (int)s_00);
  bVar1 = VerifyUTF8Fallback::anon_class_8_1_4e65a6d9::operator()(&local_48,ptr,s_00);
  if (bVar1) {
    pcVar5 = ptr + (int)s_00;
  }
  else {
    pcVar5 = (char *)0x0;
  }
LAB_002fc21b:
  pcVar3 = (char *)0x0;
  if (local_40.size == 0) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8Fallback(const char* ptr,
                                                   size_t size) {
  // Copied the implementation of CordIsValid().
  LeftoverBuffer leftover;

  ptr = AppendSize(ptr, size, [&leftover](const char* p, int s) -> bool {
    return IsViewValidUTF8WithLeftover({p, static_cast<size_t>(s)}, leftover);
  });
  return leftover.empty() ? ptr : nullptr;
}